

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwaLookups.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_25a1::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  ushort uVar1;
  ushort uVar2;
  size_t sVar3;
  bool bVar4;
  int i;
  ulong uVar5;
  size_t sVar6;
  ushort *puVar7;
  ulong uVar8;
  ulong unaff_RBX;
  ulong uVar9;
  half tmp;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  half candidate [16];
  ushort local_58 [20];
  
  uVar13 = this->_startValue;
  uVar12 = this->_endValue;
  if (uVar13 < uVar12) {
    do {
      sVar6 = this->_startValue;
      if ((uVar13 * -0x70a3d70a3d70a3d7 >> 2 | uVar13 * -0x70a3d70a3d70a3d7 << 0x3e) <
          0x28f5c28f5c28f5d && outputProgress) {
        fprintf(_stderr," Building acceleration for DwaCompressor, %.2f %%      %c",
                ((double)uVar13 * 100.0) / (double)(uVar12 - sVar6),0xd);
        sVar6 = this->_startValue;
      }
      uVar1 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)uVar13 & 0xff];
      uVar2 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)(uVar13 >> 8) & 0xff];
      this->_offset[uVar13 - sVar6] = this->_numElements;
      uVar10 = (uint)uVar2 + (uint)uVar1;
      if (uVar10 == 0) {
        sVar6 = 0;
      }
      else {
        sVar6 = (size_t)uVar10;
        uVar12 = 0;
        uVar11 = uVar10;
        do {
          uVar11 = uVar11 - 1;
          uVar5 = 0;
          bVar4 = false;
          do {
            if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)
                                ::numBitsSet)[uVar5 >> 8 & 0xffffff] +
                (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)
                                ::numBitsSet)[uVar5 & 0xff] == uVar11) {
              if (bVar4) {
                if (ABS(half::_toFloat[uVar13 & 0xffff].f - half::_toFloat[unaff_RBX & 0xffff].f) <=
                    ABS(half::_toFloat[uVar13 & 0xffff].f - half::_toFloat[uVar5].f))
                goto LAB_0011104a;
              }
              else {
                bVar4 = true;
              }
              unaff_RBX = uVar5 & 0xffffffff;
            }
LAB_0011104a:
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x10000);
          if (!bVar4) {
            _GLOBAL__N_1::LutHeaderWorker::run();
          }
          local_58[uVar12] = (ushort)unaff_RBX;
          uVar12 = uVar12 + 1;
        } while (uVar12 != sVar6);
        uVar12 = sVar6;
        puVar7 = local_58;
        uVar5 = 0;
        do {
          uVar8 = uVar5 + 1;
          if (uVar8 < sVar6) {
            uVar9 = 1;
            do {
              uVar1 = local_58[uVar5];
              uVar2 = puVar7[uVar9];
              if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 & 0xff] <
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar1 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar1 & 0xff]) {
                local_58[uVar5] = uVar2;
                puVar7[uVar9] = uVar1;
              }
              uVar9 = uVar9 + 1;
            } while (uVar12 != uVar9);
          }
          puVar7 = puVar7 + 1;
          uVar12 = uVar12 - 1;
          uVar5 = uVar8;
        } while (uVar8 != sVar6);
        sVar3 = this->_numElements;
        memcpy(this->_elements + sVar3,local_58,(ulong)(uVar10 * 2));
        this->_numElements = sVar3 + (uVar10 - 1) + 1;
      }
      uVar12 = this->_endValue;
      if (uVar13 == uVar12 - 1) {
        this->_lastCandidateCount = sVar6;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar12);
  }
  return;
}

Assistant:

void run(bool outputProgress)
            {
                half candidate[16];
                int  candidateCount = 0;

                for (size_t input=_startValue; input<_endValue; ++input) {

                    if (outputProgress) {
#ifdef __GNUC__
                        if (input % 100 == 0) {
                            fprintf(stderr, 
                            " Building acceleration for DwaCompressor, %.2f %%      %c",
                                          100.*(float)input/(float)numValues(), 13);
                        }
#else
                        if (input % 1000 == 0) {
                            fprintf(stderr, 
                            " Building acceleration for DwaCompressor, %.2f %%\n",
                                          100.*(float)input/(float)numValues());
                        }
#endif
                    } 

                    
                    int  numSetBits = countSetBits(input);
                    half inputHalf, closestHalf;

                    inputHalf.setBits(input);

                    _offset[input - _startValue] = _numElements;

                    // Gather candidates
                    candidateCount = 0;
                    for (int targetNumSetBits=numSetBits-1; targetNumSetBits>=0;
                                                           --targetNumSetBits) {
                        bool valueFound = false;

                        for (int i=0; i<65536; ++i) {
                            if (countSetBits(i) != targetNumSetBits) continue;

                            if (!valueFound) {
                                closestHalf.setBits(i);
                                valueFound = true;
                            } else {
                                half tmpHalf;

                                tmpHalf.setBits(i);

                                if (fabs((float)inputHalf - (float)tmpHalf) < 
                                    fabs((float)inputHalf - (float)closestHalf)) {
                                    closestHalf = tmpHalf;
                                }
                            }
                        }

                        if (valueFound == false) {
                            fprintf(stderr, "bork bork bork!\n");
                        }       

                        candidate[candidateCount] = closestHalf;
                        candidateCount++;
                    }

                    // Sort candidates by increasing number of bits set
                    for (int i=0; i<candidateCount; ++i) {
                        for (int j=i+1; j<candidateCount; ++j) {

                            int   iCnt = countSetBits(candidate[i].bits());
                            int   jCnt = countSetBits(candidate[j].bits());

                            if (jCnt < iCnt) {
                                half tmp     = candidate[i];
                                candidate[i] = candidate[j];
                                candidate[j] = tmp;
                            }
                        }
                    }

                    // Copy candidates to the data buffer;
                    for (int i=0; i<candidateCount; ++i) {
                        _elements[_numElements] = candidate[i].bits();
                        _numElements++;
                    }

                    if (input == _endValue-1) {
                        _lastCandidateCount = candidateCount;
                    }
                }
            }